

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

TPZTransform<double> *
pztopology::TPZLine::SideToSideTransform
          (TPZTransform<double> *__return_storage_ptr__,int sidefrom,int sideto)

{
  double dVar1;
  uint col;
  uint row;
  ostream *poVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  int dim;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong col_00;
  
  if ((uint)sidefrom < 3 && (uint)sideto < 3) {
    lVar3 = (long)sidefrom;
    if (sidefrom == sideto) {
      dim = (&DAT_012ee754)[lVar3];
      goto LAB_00dfbac5;
    }
    if (sidefrom == 2) {
      TransformElementToSide(__return_storage_ptr__,sideto);
      return __return_storage_ptr__;
    }
    if (sideto == 2) {
      TransformSideToElement(__return_storage_ptr__,sidefrom);
      return __return_storage_ptr__;
    }
    uVar6 = (ulong)*(uint *)(nhighdimsides + lVar3 * 4);
    if ((int)*(uint *)(nhighdimsides + lVar3 * 4) < 1) {
      uVar6 = 0;
    }
    uVar11 = 0;
    pdVar5 = (double *)(sidetosidetransforms + lVar3 * 0x60);
    while (pdVar8 = pdVar5, uVar10 = uVar11, uVar10 != uVar6) {
      uVar11 = uVar10 + 1;
      pdVar5 = pdVar8 + 0xc;
      if (*(int *)(pztopology::highsides + uVar10 * 4 + lVar3 * 4) == sideto) {
        col = (&DAT_012ee754)[lVar3];
        row = (&DAT_012ee754)[sideto];
        TPZTransform<double>::TPZTransform(__return_storage_ptr__,row,col);
        uVar11 = 0;
        uVar6 = (ulong)col;
        if ((int)col < 1) {
          uVar6 = uVar11;
        }
        uVar7 = (ulong)row;
        if ((int)row < 1) {
          uVar7 = uVar11;
        }
        for (; uVar11 != uVar7; uVar11 = uVar11 + 1) {
          pdVar5 = pdVar8;
          for (col_00 = 0; uVar6 != col_00; col_00 = col_00 + 1) {
            dVar1 = *pdVar5;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&(__return_storage_ptr__->fMult).super_TPZFMatrix<double>,uVar11,
                                col_00);
            *pdVar4 = dVar1;
            pdVar5 = pdVar5 + 3;
          }
          dVar1 = *(double *)(uVar10 * 0x60 + lVar3 * 0x60 + 0x12ee658 + uVar11 * 8);
          pdVar5 = TPZFMatrix<double>::operator()
                             (&(__return_storage_ptr__->fSum).super_TPZFMatrix<double>,uVar11,0);
          *pdVar5 = dVar1;
          pdVar8 = pdVar8 + 1;
        }
        return __return_storage_ptr__;
      }
    }
    pcVar9 = "TPZLine::SideToSideTransform highside not found sidefrom ";
  }
  else {
    pcVar9 = "TPZLine::HigherDimensionSides sidefrom ";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar9);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sidefrom);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sideto);
  std::endl<char,std::char_traits<char>>(poVar2);
  dim = 0;
LAB_00dfbac5:
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,dim);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZLine::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "TPZLine::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(sidedimension[sidefrom]);
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
        
        if (sideto == NSides -1) {
            return TransformSideToElement(sidefrom);
        }
        
		int nhigh = nhighdimsides[sidefrom];
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[sidefrom][is] == sideto) {
				int dfr = sidedimension[sidefrom];
				int dto = sidedimension[sideto];
				TPZTransform<> trans(dto,dfr);
				int i,j;
				for(i=0; i<dto; i++) {
					for(j=0; j<dfr; j++) {
						trans.Mult()(i,j) = sidetosidetransforms[sidefrom][is][j][i];
					}
					trans.Sum()(i,0) = sidetosidetransforms[sidefrom][is][3][i];
				}
				return trans;
			}
		}
		PZError << "TPZLine::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}